

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void ActionUnserialize::SerReadWriteMany<DataStream,COutPoint&,CScript&,unsigned_int&>
               (DataStream *s,COutPoint *args,CScript *args_1,uint *args_2)

{
  uint *__nbytes;
  long in_FS_OFFSET;
  uint32_t obj;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  DataStream::read(s,(int)args,(void *)0x20,(size_t)args_2);
  DataStream::read(s,(int)&local_34,(void *)0x4,(size_t)__nbytes);
  args->n = local_34;
  Unserialize<DataStream,28u,unsigned_char>(s,&args_1->super_CScriptBase);
  DataStream::read(s,(int)&local_34,(void *)0x4,(size_t)__nbytes);
  *args_2 = local_34;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }